

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

void jinit_huff_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  int (*__s) [64];
  int iVar2;
  
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x170);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_huff_decoder;
  if (cinfo->progressive_mode == 0) {
    pjVar1[7].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
    pjVar1[8].start_pass = (_func_void_j_decompress_ptr *)0x0;
    pjVar1[6].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
    pjVar1[7].start_pass = (_func_void_j_decompress_ptr *)0x0;
    pjVar1[8].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
    pjVar1[9].start_pass = (_func_void_j_decompress_ptr *)0x0;
    pjVar1[9].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
    pjVar1[10].start_pass = (_func_void_j_decompress_ptr *)0x0;
  }
  else {
    __s = (int (*) [64])
          (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 8);
    cinfo->coef_bits = __s;
    if (0 < cinfo->num_components) {
      iVar2 = 0;
      do {
        memset(__s,0xff,0x100);
        __s = __s + 1;
        iVar2 = iVar2 + 1;
      } while (iVar2 < cinfo->num_components);
    }
    pjVar1[5].start_pass = (_func_void_j_decompress_ptr *)0x0;
    pjVar1[5].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
    pjVar1[4].start_pass = (_func_void_j_decompress_ptr *)0x0;
    pjVar1[4].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_decoder (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(huff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *) entropy;
  entropy->pub.start_pass = start_pass_huff_decoder;

  if (cinfo->progressive_mode) {
    /* Create progression status table */
    int *coef_bit_ptr, ci;
    cinfo->coef_bits = (int (*)[DCTSIZE2])
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  cinfo->num_components*DCTSIZE2*SIZEOF(int));
    coef_bit_ptr = & cinfo->coef_bits[0][0];
    for (ci = 0; ci < cinfo->num_components; ci++)
      for (i = 0; i < DCTSIZE2; i++)
	*coef_bit_ptr++ = -1;

    /* Mark derived tables unallocated */
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      entropy->derived_tbls[i] = NULL;
    }
  } else {
    /* Mark tables unallocated */
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
    }
  }
}